

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

string * random_hex_string_abi_cxx11_(string *__return_storage_ptr__,uint64_t length)

{
  uniform_int_distribution<int> *__param;
  long lVar1;
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-0x142] == '\0') {
    random_hex_string_abi_cxx11_();
  }
  if ((char)in_FS_OFFSET[-0x13e] == '\0') {
    random_hex_string_abi_cxx11_();
  }
  if ((char)in_FS_OFFSET[-4] == '\0') {
    random_hex_string_abi_cxx11_();
  }
  if (*(char *)((long)in_FS_OFFSET + -0x14) == '\0') {
    random_hex_string_abi_cxx11_();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (length != 0) {
    lVar1 = *in_FS_OFFSET;
    __param = (uniform_int_distribution<int> *)(lVar1 + -0x1c);
    do {
      std::uniform_int_distribution<int>::operator()
                (__param,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)(lVar1 + -0x9e8),(param_type *)__param);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      length = length - 1;
    } while (length != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string random_hex_string(uint64_t length) {
    constexpr static char charset[] = "0123456789abcdef";
    thread_local static std::random_device rd;
    thread_local static std::seed_seq seed{
        rd(), rd(), rd(), rd()};  // A bit better than pathetic default
    thread_local static std::mt19937_64 random(seed);
    thread_local static std::uniform_int_distribution<int> pick(
        0, sizeof(charset) - 2);

    std::string result;
    result.reserve(length);

    for (uint64_t i = 0; i < length; i++) {
        result += charset[pick(random)];
    }

    return result;
}